

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddConditionalBranch
          (InstructionBuilder *this,uint32_t cond_id,uint32_t true_id,uint32_t false_id,
          uint32_t merge_id,uint32_t selection_control)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *pIVar1;
  IRContext *c;
  Operand *local_1b8;
  allocator<spvtools::opt::Operand> local_1a5;
  uint32_t local_1a4;
  iterator local_1a0;
  undefined8 local_198;
  SmallVector<unsigned_int,_2UL> local_190;
  uint32_t local_164;
  iterator local_160;
  undefined8 local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  uint32_t local_124;
  iterator local_120;
  undefined8 local_118;
  SmallVector<unsigned_int,_2UL> local_110;
  Operand local_e8;
  Operand OStack_b8;
  Operand OStack_88;
  iterator local_58;
  _func_int **local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_branch;
  uint32_t selection_control_local;
  uint32_t merge_id_local;
  uint32_t false_id_local;
  uint32_t true_id_local;
  uint32_t cond_id_local;
  InstructionBuilder *this_local;
  
  new_branch._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = selection_control
  ;
  if (merge_id != 0xffffffff) {
    AddSelectionMerge(this,merge_id,selection_control);
  }
  pIVar1 = (Instruction *)operator_new(0x70);
  c = GetContext(this);
  local_120 = &local_124;
  local_118 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_120;
  local_124 = cond_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_110,init_list_01);
  Operand::Operand(&local_e8,SPV_OPERAND_TYPE_ID,&local_110);
  local_160 = &local_164;
  local_158 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_160;
  local_164 = true_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_00);
  Operand::Operand(&OStack_b8,SPV_OPERAND_TYPE_ID,&local_150);
  local_1a0 = &local_1a4;
  local_198 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_1a0;
  local_1a4 = false_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_190,init_list);
  Operand::Operand(&OStack_88,SPV_OPERAND_TYPE_ID,&local_190);
  local_58 = &local_e8;
  local_50 = (_func_int **)0x3;
  std::allocator<spvtools::opt::Operand>::allocator(&local_1a5);
  __l._M_len = (size_type)local_50;
  __l._M_array = local_58;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_48,__l,&local_1a5);
  Instruction::Instruction(pIVar1,c,OpBranchConditional,0,0,&local_48);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_30,pIVar1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_1a5);
  local_1b8 = (Operand *)&local_58;
  do {
    local_1b8 = local_1b8 + -1;
    Operand::~Operand(local_1b8);
  } while (local_1b8 != &local_e8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_190);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
  pIVar1 = AddInstruction(this,&local_30);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_30);
  return pIVar1;
}

Assistant:

Instruction* AddConditionalBranch(
      uint32_t cond_id, uint32_t true_id, uint32_t false_id,
      uint32_t merge_id = kInvalidId,
      uint32_t selection_control =
          static_cast<uint32_t>(spv::SelectionControlMask::MaskNone)) {
    if (merge_id != kInvalidId) {
      AddSelectionMerge(merge_id, selection_control);
    }
    std::unique_ptr<Instruction> new_branch(new Instruction(
        GetContext(), spv::Op::OpBranchConditional, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {cond_id}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {true_id}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {false_id}}}));
    return AddInstruction(std::move(new_branch));
  }